

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

Aig_Obj_t *
Cgt_ManConstructCareCondition
          (Cgt_Man_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObjLo,Vec_Ptr_t *vCopy0,Vec_Ptr_t *vCopy1)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  Aig_Obj_t *p1;
  uint uVar10;
  long lVar11;
  
  if ((*(uint *)&pObjLo->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObjLo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0xd8,
                  "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Cgt_ManDetectFanout(p->pAig,pObjLo,p->pPars->nOdcMax,p->vFanout);
  Cgt_ManCollectVisited(p->pAig,p->vFanout,p->vVisited);
  pVVar8 = p->vVisited;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar11];
      if ((*(uint *)((long)pvVar2 + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                      ,0xdf,
                      "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      piVar6 = (int *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
      if (((piVar6[6] & 7U) == 2) && (*piVar6 < p->pAig->nTruePis)) {
        if (*(ulong *)((long)pvVar2 + 8) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = piVar6[9];
        }
        if (((int)uVar5 < 0) || (vCopy0->nSize <= (int)uVar5)) goto LAB_008d10ca;
        if (vCopy0->pArray[uVar5] == (void *)0x0) {
          pAVar7 = Aig_ObjCreateCi(pNew);
          if (*(ulong *)((long)pvVar2 + 8) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x24);
          }
          if (((int)uVar5 < 0) || (vCopy0->nSize <= (int)uVar5)) goto LAB_008d10e9;
          vCopy0->pArray[uVar5] = pAVar7;
          if (*(ulong *)((long)pvVar2 + 8) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x24);
          }
          if (((int)uVar5 < 0) || (vCopy1->nSize <= (int)uVar5)) goto LAB_008d10e9;
          vCopy1->pArray[uVar5] = pAVar7;
        }
      }
      piVar6 = (int *)(*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe);
      if (((piVar6[6] & 7U) == 2) && (*piVar6 < p->pAig->nTruePis)) {
        if (*(ulong *)((long)pvVar2 + 0x10) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = piVar6[9];
        }
        if (((int)uVar5 < 0) || (vCopy0->nSize <= (int)uVar5)) goto LAB_008d10ca;
        if (vCopy0->pArray[uVar5] == (void *)0x0) {
          pAVar7 = Aig_ObjCreateCi(pNew);
          if (*(ulong *)((long)pvVar2 + 0x10) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x24);
          }
          if (((int)uVar5 < 0) || (vCopy0->nSize <= (int)uVar5)) goto LAB_008d10e9;
          vCopy0->pArray[uVar5] = pAVar7;
          if (*(ulong *)((long)pvVar2 + 0x10) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x24);
          }
          if (((int)uVar5 < 0) || (vCopy1->nSize <= (int)uVar5)) goto LAB_008d10e9;
          vCopy1->pArray[uVar5] = pAVar7;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar8 = p->vVisited;
    } while (lVar11 < pVVar8->nSize);
  }
  pVVar8 = p->vVisited;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar11];
      uVar3 = *(ulong *)((long)pvVar2 + 8);
      if (uVar3 == 0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar5 < 0) || (vCopy0->nSize <= (int)uVar5)) goto LAB_008d10ca;
      uVar4 = *(ulong *)((long)pvVar2 + 0x10);
      if (uVar4 == 0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar10 < 0) || (vCopy0->nSize <= (int)uVar10)) goto LAB_008d10ca;
      pAVar7 = Aig_And(pNew,(Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ (ulong)vCopy0->pArray[uVar5]),
                       (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ (ulong)vCopy0->pArray[uVar10]));
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar1 < 0) || (vCopy0->nSize <= iVar1)) {
LAB_008d10e9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vCopy0->pArray[iVar1] = pAVar7;
      uVar3 = *(ulong *)((long)pvVar2 + 8);
      if (uVar3 == 0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar5 < 0) || (vCopy1->nSize <= (int)uVar5)) goto LAB_008d10ca;
      uVar4 = *(ulong *)((long)pvVar2 + 0x10);
      if (uVar4 == 0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar10 < 0) || (vCopy1->nSize <= (int)uVar10)) goto LAB_008d10ca;
      pAVar7 = Aig_And(pNew,(Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ (ulong)vCopy1->pArray[uVar5]),
                       (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ (ulong)vCopy1->pArray[uVar10]));
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar1 < 0) || (vCopy1->nSize <= iVar1)) goto LAB_008d10e9;
      vCopy1->pArray[iVar1] = pAVar7;
      lVar11 = lVar11 + 1;
      pVVar8 = p->vVisited;
    } while (lVar11 < pVVar8->nSize);
  }
  pAVar7 = (Aig_Obj_t *)((ulong)pNew->pConst1 ^ 1);
  pVVar8 = p->vFanout;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      iVar1 = *(int *)((long)pVVar8->pArray[lVar11] + 0x24);
      lVar9 = (long)iVar1;
      if (((lVar9 < 0) || (vCopy0->nSize <= iVar1)) || (vCopy1->nSize <= iVar1)) {
LAB_008d10ca:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p1 = Aig_Exor(pNew,(Aig_Obj_t *)vCopy0->pArray[lVar9],(Aig_Obj_t *)vCopy1->pArray[lVar9]);
      pAVar7 = Aig_Or(pNew,pAVar7,p1);
      lVar11 = lVar11 + 1;
      pVVar8 = p->vFanout;
    } while (lVar11 < pVVar8->nSize);
  }
  return pAVar7;
}

Assistant:

Aig_Obj_t * Cgt_ManConstructCareCondition( Cgt_Man_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObjLo, Vec_Ptr_t * vCopy0, Vec_Ptr_t * vCopy1 )
{
    Aig_Obj_t * pMiter, * pObj, * pTemp;
    int i;
    assert( Aig_ObjIsCi(pObjLo) );
    // detect nodes and their cone
    Cgt_ManDetectFanout( p->pAig, pObjLo, p->pPars->nOdcMax, p->vFanout );
    Cgt_ManCollectVisited( p->pAig, p->vFanout, p->vVisited );
    // add new variables if the observability condition depends on PI variables
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin0(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId0(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId0(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId0(pObj), pTemp );
        }
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin1(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId1(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId1(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId1(pObj), pTemp );
        }
    }
    // construct AIGs for the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy0, pObj), Aig_ObjChild1CopyVec(vCopy0, pObj) );
        Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObj), pTemp );
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy1, pObj), Aig_ObjChild1CopyVec(vCopy1, pObj) );
        Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObj), pTemp );
    }
    // construct the care miter
    pMiter = Aig_ManConst0( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanout, pObj, i )
    {
        pTemp = Aig_Exor( pNew, (Aig_Obj_t *)Vec_PtrEntry(vCopy0, Aig_ObjId(pObj)), (Aig_Obj_t *)Vec_PtrEntry(vCopy1, Aig_ObjId(pObj)) );
        pMiter = Aig_Or( pNew, pMiter, pTemp );
    }
    return pMiter;
}